

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocate.cpp
# Opt level: O2

void Relocation::dirRELOCATE_TABLE(void)

{
  int iVar1;
  long lVar2;
  size_t offsetIndex;
  ulong uVar3;
  aint subtract_offset;
  
  subtract_offset = 0;
  iVar1 = SkipBlanks(&lp);
  if ((iVar1 == 0) && (iVar1 = ParseExpressionNoSyntaxError(&lp,&subtract_offset), iVar1 == 0)) {
    Error("[RELOCATE_TABLE] Syntax error in <subtract_offset>",bp,SUPPRESS);
    return;
  }
  refreshMaxTableCount();
  for (uVar3 = 0; uVar3 < maxTableCount; uVar3 = uVar3 + 1) {
    lVar2 = offsets;
    if ((ulong)(DAT_0018a338 - offsets >> 1) <= uVar3) {
      lVar2 = offsetsPrevious;
    }
    EmitWord((uint)*(ushort *)(lVar2 + uVar3 * 2) - subtract_offset,false);
  }
  warnAboutContentChange = pass == 3;
  return;
}

Assistant:

void Relocation::dirRELOCATE_TABLE() {
	aint subtract_offset = 0;
	if (!SkipBlanks(lp)) {	// should be either empty remaining of line, or <subtract_offset>
		if (!ParseExpressionNoSyntaxError(lp, subtract_offset)) {
			Error("[RELOCATE_TABLE] Syntax error in <subtract_offset>", bp, SUPPRESS);
			return;
		}
	}
	refreshMaxTableCount();
	// dump the table into machine code output
	for (size_t offsetIndex = 0; offsetIndex < maxTableCount; ++offsetIndex) {
		// select offset from current pass table if possible, but use "offsetsPrevious" as backup
		const auto offset = (offsetIndex < offsets.size()) ? offsets[offsetIndex] : offsetsPrevious[offsetIndex];
		EmitWord(offset - subtract_offset);
	}
	warnAboutContentChange = (LASTPASS == pass);	// set in last pass to check consistency
}